

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

ExprPtr __thiscall mathiu::impl::substitute(impl *this,ExprPtr *ex,ExprPtr *srcDstPairs)

{
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *p_Var1;
  impl *piVar2;
  bool bVar3;
  long lVar4;
  variant_alternative_t<1UL,_variant<monostate,_const_Set_*,_const_Pair_*,_bool>_> *value;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>_&>
  pIVar5;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>_&>
  pSVar6;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  *ppVar7;
  iterator iVar8;
  const_iterator __position;
  _Base_ptr p_Var9;
  variant_alternative_t<2UL,_variant<monostate,_const_Set_*,_const_Pair_*,_bool>_> *value_00;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>_&>
  pIVar10;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>_&>
  __a;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>_&>
  pPVar11;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  IdProcess IVar12;
  _Rb_tree_header *p_Var13;
  ExprPtr EVar14;
  initializer_list<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>
  __l;
  ContextT context;
  Id<mathiu::impl::Pair> iPair;
  Id<mathiu::impl::Set> iSet;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_4d8;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_4a8;
  IdProcess local_474;
  pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_470;
  element_type *local_450;
  undefined8 local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_440;
  undefined8 local_438;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_430;
  pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
  local_428;
  _Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
  local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  long local_3c8;
  ExprPtrMap *local_3c0;
  impl *local_3b8;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  local_3b0;
  AsPointer<mathiu::impl::Pair> *local_380;
  anon_class_1_0_00000001 *paStack_378;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  local_370;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_338;
  Id<mathiu::impl::Pair> *local_328;
  AsPointer<mathiu::impl::Set> *local_320;
  undefined1 auStack_318 [8];
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  _Stack_310;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_2c8;
  Id<mathiu::impl::Set> *local_2b8;
  AsPointer<mathiu::impl::Pair> *local_2b0;
  anon_class_1_0_00000001 *paStack_2a8;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  local_2a0;
  anon_class_1_0_00000001 *local_268;
  InternalPatternT<bool> IStack_260;
  undefined7 uStack_25f;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
  local_258;
  undefined1 local_220 [48];
  __index_type local_1f0;
  AsPointer<mathiu::impl::Set> *local_1e8;
  _Variadic_union<mathiu::impl::Set_*,_const_mathiu::impl::Set_*> _Stack_1e0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_1d8;
  anon_class_1_0_00000001 *local_190;
  InternalPatternT<bool> IStack_188;
  undefined7 uStack_187;
  App<const_matchit::impl::AsPointer<mathiu::impl::Pair>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>_>
  local_180;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
  local_128;
  undefined1 local_e0 [64];
  __index_type local_a0;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_98;
  
  local_320 = (AsPointer<mathiu::impl::Set> *)((ulong)local_320 & 0xffffffff00000000);
  auStack_318 = (undefined1  [8])0x0;
  _Stack_310._M_u._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>_*>)0x0;
  _Stack_310._M_u._8_8_ = 0;
  _Stack_310._M_u._16_8_ = 0;
  _Stack_310._M_u._24_8_ = 0;
  _Stack_310._M_u._32_8_ = 0;
  _Stack_310._M_u._40_8_ = 0;
  local_e0._0_4_ = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                     *)(local_e0 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                     *)auStack_318);
  local_a0 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                       *)auStack_318);
  local_320 = (AsPointer<mathiu::impl::Set> *)((ulong)local_320 & 0xffffffff00000000);
  auStack_318 = (undefined1  [8])0x0;
  _Stack_310._M_u._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Set>_*>)0x0;
  _Stack_310._M_u._8_8_ = 0;
  _Stack_310._M_u._16_8_ = 0;
  _Stack_310._M_u._24_8_ = 0;
  local_220._0_4_ = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>
                     *)(local_220 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>
                     *)auStack_318);
  local_1f0 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Pair,_mathiu::impl::Pair_*,_const_mathiu::impl::Pair_*>
                       *)auStack_318);
  local_450 = (srcDstPairs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&local_128,(Id<mathiu::impl::Set> *)local_e0);
  matchit::impl::as<mathiu::impl::Set>::{lambda(auto:1)#1}::operator()
            (&local_98,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Set>,
             (Id<mathiu::impl::Set> *)&local_128);
  local_1e8 = local_98.mUnary;
  _Stack_1e0 = (_Variadic_union<mathiu::impl::Set_*,_const_mathiu::impl::Set_*>)
               local_98.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
               ._M_head_impl.mUnary;
  local_3c0 = (ExprPtrMap *)ex;
  local_3b8 = this;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&local_1d8,
             (InternalPatternT<matchit::impl::Id<mathiu::impl::Set>_> *)
             ((long)&local_98.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
             + 8));
  local_190 = local_98.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_188 = local_98.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_187 = local_98.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_320 = local_1e8;
  auStack_318 = (undefined1  [8])_Stack_1e0;
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)&_Stack_310,(Id<mathiu::impl::Set> *)&local_1d8);
  local_2c8.mUnary = local_190;
  local_2c8.mPattern = IStack_188;
  local_2c8._9_7_ = uStack_187;
  local_2b8 = (Id<mathiu::impl::Set> *)local_e0;
  matchit::impl::Id<mathiu::impl::Pair>::Id
            ((Id<mathiu::impl::Pair> *)&local_258,(Id<mathiu::impl::Pair> *)local_220);
  matchit::impl::as<mathiu::impl::Pair>::{lambda(auto:1)#1}::operator()
            (&local_180,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Pair>,
             (Id<mathiu::impl::Pair> *)&local_258);
  local_2b0 = local_180.mUnary;
  paStack_2a8 = local_180.mPattern.mPatterns.
                super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                .
                super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                .
                super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
                ._M_head_impl.mUnary;
  matchit::impl::Id<mathiu::impl::Pair>::Id
            ((Id<mathiu::impl::Pair> *)&local_2a0,
             (InternalPatternT<matchit::impl::Id<mathiu::impl::Pair>_> *)
             ((long)&local_180.mPattern.mPatterns.
                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
             + 8));
  local_268 = local_180.mPattern.mPatterns.
              super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
              .
              super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
              ._M_head_impl.mUnary;
  IStack_260 = local_180.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl.mPattern;
  uStack_25f = local_180.mPattern.mPatterns.
               super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
               .
               super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
               ._M_head_impl._9_7_;
  local_380 = local_2b0;
  paStack_378 = paStack_2a8;
  matchit::impl::Id<mathiu::impl::Pair>::Id
            ((Id<mathiu::impl::Pair> *)&local_370,(Id<mathiu::impl::Pair> *)&local_2a0);
  local_338.mUnary = local_268;
  local_338.mPattern = IStack_260;
  local_338._9_7_ = uStack_25f;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4d8._M_impl.super__Rb_tree_header._M_header;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4d8._M_impl._0_8_ = 0;
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_4d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3f8 = 0;
  uStack_3f0 = 0;
  local_408 = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
               )0x0;
  uStack_400 = 0;
  lVar4 = 8;
  do {
    *(undefined1 *)((long)&local_408 + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x48);
  local_3c8 = 0;
  local_4a8._M_impl._0_8_ = (element_type *)0x0;
  if (*(__index_type *)
       ((long)&(local_450->super_ExprVariant).
               super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
       + 0x38) == '\r') {
    local_4a8._M_impl._0_8_ = local_450;
  }
  local_4d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_328 = (Id<mathiu::impl::Pair> *)local_220;
  std::variant<std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool>::operator=
            ((variant<std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool> *)
             &local_408,(Set **)&local_4a8);
  lVar4 = local_3c8 * 2;
  local_3c8 = local_3c8 + 1;
  value = std::get<1ul,std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool>
                    ((variant<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
                      *)(&local_408 + lVar4));
  bVar3 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Set_const*&,matchit::impl::Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool>>
                    (value,&local_2c8,2,
                     (Context<const_mathiu::impl::Set_*,_bool,_const_mathiu::impl::Pair_*,_bool> *)
                     &local_408);
  if (bVar3) {
    bVar3 = matchit::impl::Id<mathiu::impl::Set>::matchValue<mathiu::impl::Set_const&>
                      ((Id<mathiu::impl::Set> *)&_Stack_310,*value);
    IVar12 = (IdProcess)bVar3;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
              ((Id<mathiu::impl::Set> *)&_Stack_310,3,IVar12);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
              ((Id<mathiu::impl::Set> *)&_Stack_310,2,(uint)bVar3);
  }
  else {
    IVar12 = kCANCEL;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
            ((Id<mathiu::impl::Set> *)&_Stack_310,1,IVar12);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Set>_>::processIdImpl
            ((Id<mathiu::impl::Set> *)&_Stack_310,0,IVar12);
  if (IVar12 != kCANCEL) {
    local_4a8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_4a8._M_impl.super__Rb_tree_header._M_header;
    local_4a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_4a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_4a8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_4a8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_474 = IVar12;
    pIVar5 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>&)_1_,matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Set>,matchit::impl::IdBlock<mathiu::impl::Set>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                         *)&local_470,&local_2b8->mBlock);
    pSVar6 = std::
             visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Set,mathiu::impl::Set*,mathiu::impl::Set_const*>const&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                         *)&local_470,&(pIVar5->super_IdBlockBase<mathiu::impl::Set>).mVariant);
    p_Var9 = (pSVar6->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pIVar5 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>&)_1_,matchit::impl::Id<mathiu::impl::Set>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Set>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Set>,matchit::impl::IdBlock<mathiu::impl::Set>*>&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                         *)&local_470,&local_2b8->mBlock);
    pSVar6 = std::
             visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(mathiu::impl::Set*)_1_,matchit::impl::IdBlock<mathiu::impl::Set>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Set,mathiu::impl::Set*,mathiu::impl::Set_const*>const&>
                       ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                         *)&local_470,&(pIVar5->super_IdBlockBase<mathiu::impl::Set>).mVariant);
    p_Var13 = &(pSVar6->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var13) {
      __position._M_node = &local_4a8._M_impl.super__Rb_tree_header._M_header;
      do {
        ppVar7 = &std::
                  get<17ul,int,mathiu::impl::Fraction,mathiu::impl::Symbol,mathiu::impl::Pi,mathiu::impl::E,mathiu::impl::I,mathiu::impl::Infinity,mathiu::impl::Sum,mathiu::impl::Product,mathiu::impl::Power,mathiu::impl::Log,mathiu::impl::Sin,mathiu::impl::Arctan,mathiu::impl::Set,mathiu::impl::List,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,mathiu::impl::PieceWise,mathiu::impl::Pair,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,mathiu::impl::True,mathiu::impl::False,mathiu::impl::Logical,mathiu::impl::SetOp>
                            (*(variant<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
                               **)(p_Var9 + 1))->super_ExprPtrPair;
        std::
        pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
        ::pair(&local_470,ppVar7);
        local_438 = 0;
        local_428.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_470.first.
                 super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_428.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_470.first.
             super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        local_448 = 0;
        local_428.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_470.second.
                 super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Stack_430 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_428.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_470.second.
             super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        local_470.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_4a8;
        iVar8 = std::
                _Rb_tree<std::shared_ptr<mathiu::impl::Expr_const>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>,std::_Select1st<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                ::
                _M_insert_unique_<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>,std::_Rb_tree<std::shared_ptr<mathiu::impl::Expr_const>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>,std::_Select1st<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>::_Alloc_node>
                          ((_Rb_tree<std::shared_ptr<mathiu::impl::Expr_const>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>,std::_Select1st<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>
                            *)local_470.first.
                              super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,__position,&local_428,(_Alloc_node *)&local_470);
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar8._M_node);
        if (local_428.second.
            super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_428.second.
                     super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_428.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_428.first.
                     super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (p_Stack_430 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_430);
        }
        if (local_440 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var13);
    }
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::clear(&local_4d8);
    if (local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      local_4d8._M_impl.super__Rb_tree_header._M_header._M_color =
           local_4a8._M_impl.super__Rb_tree_header._M_header._M_color;
      local_4d8._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_4d8._M_impl.super__Rb_tree_header._M_header._M_left =
           local_4a8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_4d8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_4a8._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &local_4d8._M_impl.super__Rb_tree_header._M_header;
      local_4d8._M_impl.super__Rb_tree_header._M_node_count =
           local_4a8._M_impl.super__Rb_tree_header._M_node_count;
      local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_4a8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_4a8._M_impl.super__Rb_tree_header._M_header;
      local_4a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_4a8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_4a8._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::~_Rb_tree(&local_4a8);
    if (local_474 != kCANCEL) goto LAB_0019c20e;
  }
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3f8 = 0;
  uStack_3f0 = 0;
  local_408 = (_Variadic_union<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
               )0x0;
  uStack_400 = 0;
  lVar4 = 8;
  do {
    *(undefined1 *)((long)&local_408 + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x48);
  local_3c8 = 0;
  local_4a8._M_impl._0_8_ = (element_type *)0x0;
  if (*(__index_type *)
       ((long)&(local_450->super_ExprVariant).
               super__Variant_base<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Copy_assign_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
               .
               super__Move_ctor_alias<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
       + 0x38) == '\x11') {
    local_4a8._M_impl._0_8_ = local_450;
  }
  std::variant<std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool>::operator=
            ((variant<std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool> *)
             &local_408,(Pair **)&local_4a8);
  lVar4 = local_3c8 * 2;
  local_3c8 = local_3c8 + 1;
  value_00 = std::get<2ul,std::monostate,mathiu::impl::Set_const*,mathiu::impl::Pair_const*,bool>
                       ((variant<std::monostate,_const_mathiu::impl::Set_*,_const_mathiu::impl::Pair_*,_bool>
                         *)(&local_408 + lVar4));
  bVar3 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<mathiu::impl::Pair_const*&,matchit::impl::Context<mathiu::impl::Set_const*,bool,mathiu::impl::Pair_const*,bool>>
                    (value_00,&local_338,2,
                     (Context<const_mathiu::impl::Set_*,_bool,_const_mathiu::impl::Pair_*,_bool> *)
                     &local_408);
  if (bVar3) {
    bVar3 = matchit::impl::Id<mathiu::impl::Pair>::matchValue<mathiu::impl::Pair_const&>
                      ((Id<mathiu::impl::Pair> *)&local_370,*value_00);
    IVar12 = (IdProcess)bVar3;
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
              ((Id<mathiu::impl::Pair> *)&local_370,3,IVar12);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
              ((Id<mathiu::impl::Pair> *)&local_370,2,(uint)bVar3);
  }
  else {
    IVar12 = kCANCEL;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
            ((Id<mathiu::impl::Pair> *)&local_370,1,IVar12);
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Pair>_>::processIdImpl
            ((Id<mathiu::impl::Pair> *)&local_370,0,IVar12);
  if (IVar12 != kCANCEL) {
    pIVar10 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>&)_1_,matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,matchit::impl::IdBlock<mathiu::impl::Pair>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_4a8,&local_328->mBlock);
    __a = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Pair,mathiu::impl::Pair*,mathiu::impl::Pair_const*>const&>
                    ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                      *)&local_4a8,&(pIVar10->super_IdBlockBase<mathiu::impl::Pair>).mVariant);
    pIVar10 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>&)_1_,matchit::impl::Id<mathiu::impl::Pair>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Pair>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Pair>,matchit::impl::IdBlock<mathiu::impl::Pair>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                          *)&local_4a8,&local_328->mBlock);
    pPVar11 = std::
              visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(mathiu::impl::Pair*)_1_,matchit::impl::IdBlock<mathiu::impl::Pair>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Pair,mathiu::impl::Pair*,mathiu::impl::Pair_const*>const&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                          *)&local_4a8,&(pIVar10->super_IdBlockBase<mathiu::impl::Pair>).mVariant);
    std::
    pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
    ::
    pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_true>
              ((pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                *)&local_470,(shared_ptr<const_mathiu::impl::Expr> *)__a,
               &(pPVar11->super_ExprPtrPair).second);
    __l._M_len = 1;
    __l._M_array = (pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                    *)&local_470;
    std::
    map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::map((map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
           *)&local_4a8,__l,(ExprPtrLess *)&local_428,(allocator_type *)&local_448);
    if (local_470.second.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_470.second.
                 super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_470.first.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_470.first.
                 super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::clear(&local_4d8);
    if (local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var13 = &local_4a8._M_impl.super__Rb_tree_header;
      local_4d8._M_impl.super__Rb_tree_header._M_header._M_color =
           local_4a8._M_impl.super__Rb_tree_header._M_header._M_color;
      local_4d8._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_4d8._M_impl.super__Rb_tree_header._M_header._M_left =
           local_4a8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_4d8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_4a8._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &local_4d8._M_impl.super__Rb_tree_header._M_header;
      local_4d8._M_impl.super__Rb_tree_header._M_node_count =
           local_4a8._M_impl.super__Rb_tree_header._M_node_count;
      local_4a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_4a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_4a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header;
      local_4a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var13->_M_header;
    }
    std::
    _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
    ::~_Rb_tree(&local_4a8);
    if (IVar12 != kCANCEL) {
LAB_0019c20e:
      p_Var13 = &local_3b0._M_impl.super__Rb_tree_header;
      if (local_4d8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        p_Var1 = &local_3b0;
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header;
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var13->_M_header;
      }
      else {
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_color =
             local_4d8._M_impl.super__Rb_tree_header._M_header._M_color;
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_4d8._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_left =
             local_4d8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_3b0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_4d8._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_4d8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &p_Var13->_M_header;
        local_3b0._M_impl.super__Rb_tree_header._M_node_count =
             local_4d8._M_impl.super__Rb_tree_header._M_node_count;
        local_4d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_4d8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_4d8._M_impl.super__Rb_tree_header._M_header;
        p_Var1 = &local_4d8;
        local_4d8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_4d8._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      (p_Var1->_M_impl).super__Rb_tree_header._M_node_count = 0;
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::~_Rb_tree(&local_4d8);
      std::__detail::__variant::
      _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
      ::~_Variant_storage(&local_370);
      std::__detail::__variant::
      _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
      ::~_Variant_storage(&local_2a0);
      std::__detail::__variant::
      _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
      ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                           *)((long)&local_180.mPattern.mPatterns.
                                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                     .
                                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>_>
                                     .
                                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Pair>_>,_false>
                             + 8));
      std::__detail::__variant::
      _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
      ::~_Variant_storage(&local_258);
      std::__detail::__variant::
      _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
      ::~_Variant_storage(&_Stack_310);
      std::__detail::__variant::
      _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
      ::~_Variant_storage(&local_1d8);
      std::__detail::__variant::
      _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
      ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                           *)((long)&local_98.mPattern.mPatterns.
                                     super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                     .
                                     super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>
                                     .
                                     super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>,_false>
                             + 8));
      std::__detail::__variant::
      _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
      ::~_Variant_storage(&local_128);
      piVar2 = local_3b8;
      substituteImpl((ExprPtr *)local_3b8,local_3c0);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::_Select1st<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::~_Rb_tree(&local_3b0);
      std::__detail::__variant::
      _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
      ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Pair>,_matchit::impl::IdBlock<mathiu::impl::Pair>_*>
                           *)local_220);
      std::__detail::__variant::
      _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
      ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                           *)local_e0);
      EVar14.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      EVar14.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)piVar2;
      return (ExprPtr)EVar14.
                      super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Mismatch in substitute!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ExprPtr substitute(ExprPtr const &ex, ExprPtr const &srcDstPairs)
    {
#if VERBOSE_DEBUG
        std::cout << "substitute: " << toString(ex) << " " << toString(srcDstPairs) << std::endl;
#endif // VERBOSE_DEBUG
        Id<Set> iSet;
        Id<Pair> iPair;
        auto const subMap = match(*srcDstPairs)(
            pattern | as<Set>(iSet) = [&]
            {
                ExprPtrMap result;
                std::transform((*iSet).begin(), (*iSet).end(), std::inserter(result, result.end()), [&](auto &&e)
                               {
                                   auto pair = std::get<Pair>(*e);
                                   return pair;
                               });
                return result;
            },
            pattern | as<Pair>(iPair) = [&]
            { return ExprPtrMap{{{(*iPair).first, (*iPair).second}}}; },
            pattern | _ = [&]
            {
                throw std::runtime_error("Mismatch in substitute!");
                return ExprPtrMap{};
            });
        return substituteImpl(ex, subMap);
    }